

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O2

void __thiscall Chromosome::createRandomTurnList(Chromosome *this)

{
  result_type_conflict2 rVar1;
  undefined8 in_RAX;
  int i;
  ulong uVar2;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  for (uVar2 = 0; uVar2 < GeneticAlgorithm::params.sequence._M_string_length - 1; uVar2 = uVar2 + 1)
  {
    rVar1 = std::uniform_int_distribution<int>::operator()(&uniform_dist,&randomEngine);
    uStack_38 = CONCAT44(rVar1 + -1,(undefined4)uStack_38);
    std::vector<TURNCODE,_std::allocator<TURNCODE>_>::emplace_back<TURNCODE>
              (&this->turnList,(TURNCODE *)((long)&uStack_38 + 4));
  }
  return;
}

Assistant:

void Chromosome::createRandomTurnList() {
        for (int i = 0; i  < GeneticAlgorithm::params.sequence.length() - 1; i++ ){
            int turn = uniform_dist(randomEngine) - 1;
            turnList.push_back((TURNCODE)turn);
        }
}